

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  TestInfo *this;
  TestSuite *in_RSI;
  TestResult *in_RDI;
  TestResult *in_stack_00000128;
  ostream *in_stack_00000130;
  TestInfo *in_stack_00000170;
  char *in_stack_00000178;
  ostream *in_stack_00000180;
  int i;
  bool comma;
  string kIndent;
  string kTestsuite;
  TestResult *in_stack_fffffffffffffc58;
  TestSuite *in_stack_fffffffffffffc60;
  TestResult *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  char *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffd28;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  string *in_stack_fffffffffffffd38;
  TestResult *result;
  string *in_stack_fffffffffffffd40;
  string *name;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  ostream *in_stack_fffffffffffffd50;
  TestResult *pTVar6;
  string local_250 [32];
  int local_230;
  byte local_229;
  string local_228 [32];
  TimeInMillis in_stack_fffffffffffffdf8;
  allocator<char> local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  TimeInMillis in_stack_fffffffffffffeb8;
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  TestSuite *local_10;
  TestResult *local_8;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffd28 >> 0x38);
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  std::allocator<char>::~allocator(&local_31);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffc78);
  pTVar6 = local_8;
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffc78);
  poVar4 = std::operator<<((ostream *)pTVar6,local_88);
  std::operator<<(poVar4,"{\n");
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  TestSuite::name((TestSuite *)0x1a57e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  OutputJsonKey(in_stack_fffffffffffffd50,
                (string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                (string *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),(bool)uVar5)
  ;
  iVar3 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  TestSuite::reportable_test_count((TestSuite *)0x1a58d8);
  OutputJsonKey(in_stack_fffffffffffffd50,
                (string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                in_stack_fffffffffffffd40,iVar3,
                (string *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),(bool)uVar5)
  ;
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    pTVar6 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    iVar2 = TestSuite::failed_test_count((TestSuite *)0x1a598c);
    OutputJsonKey((ostream *)pTVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd48),
                  in_stack_fffffffffffffd40,iVar3,
                  (string *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                  (bool)uVar5);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    name = (string *)&local_149;
    result = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    iVar3 = TestSuite::reportable_disabled_test_count((TestSuite *)0x1a5a33);
    OutputJsonKey((ostream *)pTVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd48),name,
                  (int)((ulong)result >> 0x20),(string *)CONCAT44(iVar3,in_stack_fffffffffffffd30),
                  (bool)uVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
    std::allocator<char>::~allocator(&local_149);
    uVar5 = (undefined1)((ulong)&local_171 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    OutputJsonKey((ostream *)pTVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd48),name,
                  (int)((ulong)result >> 0x20),(string *)CONCAT44(iVar3,in_stack_fffffffffffffd30),
                  (bool)uVar5);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    TestSuite::start_timestamp(local_10);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_fffffffffffffeb8);
    OutputJsonKey((ostream *)pTVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd48),name,
                  (string *)result,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd30),(bool)uVar5);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator(&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    TestSuite::elapsed_time(local_10);
    FormatTimeInMillisAsDuration_abi_cxx11_(in_stack_fffffffffffffdf8);
    OutputJsonKey((ostream *)pTVar6,(string *)CONCAT44(iVar2,in_stack_fffffffffffffd48),name,
                  (string *)result,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd30),(bool)uVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    pTVar6 = local_8;
    TestSuite::ad_hoc_test_result(local_10);
    TestPropertiesAsJson(result,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd30));
    poVar4 = std::operator<<((ostream *)pTVar6,local_228);
    std::operator<<(poVar4,",\n");
    std::__cxx11::string::~string(local_228);
  }
  poVar4 = std::operator<<((ostream *)local_8,local_68);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,local_30);
  std::operator<<(poVar4,"\": [\n");
  local_229 = 0;
  for (local_230 = 0; iVar3 = local_230, iVar2 = TestSuite::total_test_count((TestSuite *)0x1a6100),
      iVar3 < iVar2; local_230 = local_230 + 1) {
    this = TestSuite::GetTestInfo
                     (in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20));
    bVar1 = TestInfo::is_reportable(this);
    if (bVar1) {
      if ((local_229 & 1) == 0) {
        local_229 = 1;
      }
      else {
        std::operator<<((ostream *)local_8,",\n");
      }
      TestSuite::name((TestSuite *)0x1a6187);
      TestSuite::GetTestInfo
                (in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20));
      OutputJsonTestInfo(in_stack_00000180,in_stack_00000178,in_stack_00000170);
    }
  }
  TestSuite::ad_hoc_test_result(local_10);
  bVar1 = TestResult::Failed(in_stack_fffffffffffffc58);
  if (bVar1) {
    if ((local_229 & 1) != 0) {
      std::operator<<((ostream *)local_8,",\n");
    }
    in_stack_fffffffffffffc78 = TestSuite::ad_hoc_test_result(local_10);
    OutputJsonTestCaseForTestResult(in_stack_00000130,in_stack_00000128);
  }
  poVar4 = std::operator<<((ostream *)local_8,"\n");
  poVar4 = std::operator<<(poVar4,local_68);
  poVar4 = std::operator<<(poVar4,"]\n");
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffffc78);
  poVar4 = std::operator<<(poVar4,local_250);
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsRFC3339(test_suite.start_timestamp()),
        kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }

  // If there was a failure in the test suite setup or teardown include that in
  // the output.
  if (test_suite.ad_hoc_test_result().Failed()) {
    if (comma) {
      *stream << ",\n";
    }
    OutputJsonTestCaseForTestResult(stream, test_suite.ad_hoc_test_result());
  }

  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}